

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBSTSRunB(octet *key,bign_params *params,bake_settings *settings,octet *privkeyb,
                  bake_cert *certb,bake_certval_i vala,read_i read,write_i write,void *file)

{
  bool_t bVar1;
  err_t eVar2;
  void *state_00;
  bign_params *params_00;
  blob_t pvVar3;
  bake_settings *settings_00;
  octet *privkey;
  octet *in_RCX;
  octet *in_RDX;
  ulong *in_RSI;
  void *in_RDI;
  void *in_R8;
  bake_certval_i in_R9;
  code *in_stack_00000008;
  code *in_stack_00000010;
  undefined8 in_stack_00000018;
  blob_t M2;
  void *state;
  octet *out;
  octet *in;
  blob_t blob;
  size_t len;
  err_t code;
  void *in_stack_ffffffffffffff38;
  blob_t in_stack_ffffffffffffff40;
  bake_settings *in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  octet *in_stack_ffffffffffffff58;
  bake_cert *in_stack_ffffffffffffff68;
  blob_t local_70;
  undefined1 local_48 [8];
  undefined4 in_stack_ffffffffffffffc0;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x20);
  if ((bVar1 == 0) || (bVar1 = memIsValid(in_R8,0x18), bVar1 == 0)) {
    local_4 = 0x6d;
  }
  else if (((*in_RSI == 0x80) || (*in_RSI == 0xc0)) || (*in_RSI == 0x100)) {
    if ((*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8 < *in_RSI >> 1) {
      state_00 = (void *)(*in_RSI >> 1);
    }
    else {
      state_00 = (void *)((*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8);
    }
    params_00 = (bign_params *)((long)state_00 + 0x200);
    bakeBSTS_keep((size_t)in_stack_ffffffffffffff40);
    pvVar3 = blobCreate((size_t)in_stack_ffffffffffffff38);
    if (pvVar3 == (blob_t)0x0) {
      local_4 = 0x6e;
    }
    else {
      settings_00 = (bake_settings *)((long)pvVar3 + 0x200);
      if ((*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8 < *in_RSI >> 1) {
        privkey = (octet *)(*in_RSI >> 1);
      }
      else {
        privkey = (octet *)((*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8);
      }
      local_4 = bakeBSTSStart(state_00,params_00,settings_00,privkey,in_stack_ffffffffffffff68);
      if (local_4 == 0) {
        local_4 = bakeBSTSStep2(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if (local_4 == 0) {
          local_4 = (*in_stack_00000010)(local_48,settings_00,*in_RSI >> 1,in_stack_00000018);
          if (local_4 == 0) {
            eVar2 = (*in_stack_00000008)(local_48,pvVar3,0x200,in_stack_00000018);
            if (eVar2 == 0xffffffff) {
              eVar2 = bakeBSTSStep4(in_RDX,in_RCX,(size_t)in_R8,in_R9,
                                    (void *)CONCAT44(0xffffffff,in_stack_ffffffffffffffc0));
              if (eVar2 != 0) {
                blobClose((blob_t)0x1308be);
                return eVar2;
              }
              eVar2 = (*in_stack_00000010)
                                (local_48,settings_00,
                                 (*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8,in_stack_00000018);
              if (eVar2 != 0) {
                blobClose((blob_t)0x13092a);
                return eVar2;
              }
            }
            else {
              if (eVar2 != 0) {
                blobClose((blob_t)0x130956);
                return eVar2;
              }
              local_70 = (blob_t)0x0;
              eVar2 = 0;
              while (eVar2 == 0) {
                blobSize(local_70);
                local_70 = blobResize(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
                if (local_70 == (blob_t)0x0) {
                  blobClose((blob_t)0x1309be);
                  return 0x6e;
                }
                blobSize(local_70);
                memCopy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x130a09);
                eVar2 = (*in_stack_00000008)(local_48,pvVar3,0x200,in_stack_00000018);
              }
              if (eVar2 != 0xffffffff) {
                blobClose((blob_t)0x130a4d);
                blobClose((blob_t)0x130a57);
                return eVar2;
              }
              blobSize(local_70);
              pvVar3 = blobResize(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
              if (pvVar3 == (blob_t)0x0) {
                blobClose((blob_t)0x130aa8);
                return 0x6e;
              }
              in_stack_ffffffffffffff40 = pvVar3;
              blobSize(pvVar3);
              memCopy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x130af3);
              in_stack_ffffffffffffff48 = settings_00;
              blobSize(pvVar3);
              eVar2 = bakeBSTSStep4(in_RDX,in_RCX,(size_t)in_R8,in_R9,
                                    (void *)CONCAT44(eVar2,in_stack_ffffffffffffffc0));
              blobClose((blob_t)0x130b41);
              if (eVar2 != 0) {
                blobClose((blob_t)0x130b55);
                return eVar2;
              }
              eVar2 = (*in_stack_00000010)
                                (local_48,settings_00,
                                 (*in_RSI >> 2) + *(long *)((long)in_R8 + 8) + 8,in_stack_00000018);
              if (eVar2 != 0) {
                blobClose((blob_t)0x130bc1);
                return eVar2;
              }
            }
            local_4 = bakeBSTSStepG((octet *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
            blobClose((blob_t)0x130bf8);
          }
          else {
            blobClose((blob_t)0x130833);
          }
        }
        else {
          blobClose((blob_t)0x1307d8);
        }
      }
      else {
        blobClose((blob_t)0x13079b);
      }
    }
  }
  else {
    local_4 = 0x1f6;
  }
  return local_4;
}

Assistant:

err_t bakeBSTSRunB(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeyb[],
	const bake_cert* certb, bake_certval_i vala,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [512] */
	octet* out;			/* [MAX2(l / 2, l / 4 + certb->len + 8)] */
	void* state;		/* [bakeBSTS_keep()] */
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(certb, sizeof(bake_cert)))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(512 +
		MAX2(params->l / 2, params->l / 4 + certb->len + 8) +
		bakeBSTS_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + 512;
	state = out + MAX2(params->l / 2, params->l / 4 + certb->len + 8);
	// старт
	code = bakeBSTSStart(state, params, settings, privkeyb, certb);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 2
	code = bakeBSTSStep2(out, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 4: прочитать блок M2
	code = read(&len, in, 512, file);
	// шаг 4: M2 из одного блока?
	if (code == ERR_MAX)
	{
		code = bakeBSTSStep4(out, in, len, vala, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// шаг 4: ошибка при чтении
	else if (code != ERR_OK)
	{
		blobClose(blob);
		return code;
	}
	// шаг 4: обработать M2 из нескольких блоков
	else
	{
		blob_t M2 = 0;
		while (code == ERR_OK)
		{
			if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
			{
				blobClose(blob);
				return ERR_OUTOFMEMORY;
			}
			memCopy((octet*)M2 + blobSize(M2) - len, in, len);
			code = read(&len, in, 512, file);
		}
		if (code != ERR_MAX)
		{
			blobClose(M2);
			blobClose(blob);
			return code;
		}
		if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
		{
			blobClose(blob);
			return ERR_OUTOFMEMORY;
		}
		memCopy((octet*)M2 + blobSize(M2) - len, in, len);
		code = bakeBSTSStep4(out, M2, blobSize(M2), vala, state);
		blobClose(M2);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBSTSStepG(key, state);
	blobClose(blob);
	return code;
}